

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

int check_downrec_unroll(jit_State *J,GCproto *pt)

{
  ushort uVar1;
  ushort uVar2;
  ulong in_RSI;
  long in_RDI;
  IRRef ref;
  int count;
  IRRef ptref;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  uVar1 = *(ushort *)(in_RDI + 0x1b2);
  do {
    uVar5 = (uint)uVar1;
    if (uVar5 == 0) {
      return 0;
    }
    if (*(uint *)(*(long *)(in_RDI + 0x10) + (ulong)uVar5 * 8) == in_RSI) {
      iVar4 = 0;
      uVar2 = *(ushort *)(in_RDI + 0x198);
      while (uVar3 = (uint)uVar2, uVar3 != 0) {
        if (*(ushort *)(*(long *)(in_RDI + 0x10) + (ulong)uVar3 * 8) == uVar5) {
          iVar4 = iVar4 + 1;
        }
        uVar2 = *(ushort *)(*(long *)(in_RDI + 0x10) + 6 + (ulong)uVar3 * 8);
      }
      if (iVar4 != 0) {
        if (*(long *)(in_RDI + 0x70) != *(long *)(in_RDI + 0x9a0)) {
          lj_trace_err((jit_State *)(ulong)CONCAT24(uVar1,iVar4),LJ_TRERR_RECERR);
        }
        if (*(int *)(in_RDI + 0x674) < iVar4 + *(int *)(in_RDI + 0xe0)) {
          return 1;
        }
      }
    }
    uVar1 = *(ushort *)(*(long *)(in_RDI + 0x10) + 6 + (ulong)uVar5 * 8);
  } while( true );
}

Assistant:

static int check_downrec_unroll(jit_State *J, GCproto *pt)
{
  IRRef ptref;
  for (ptref = J->chain[IR_KGC]; ptref; ptref = IR(ptref)->prev)
    if (ir_kgc(IR(ptref)) == obj2gco(pt)) {
      int count = 0;
      IRRef ref;
      for (ref = J->chain[IR_RETF]; ref; ref = IR(ref)->prev)
	if (IR(ref)->op1 == ptref)
	  count++;
      if (count) {
	if (J->pc == J->startpc) {
	  if (count + J->tailcalled > J->param[JIT_P_recunroll])
	    return 1;
	} else {
	  lj_trace_err(J, LJ_TRERR_DOWNREC);
	}
      }
    }
  return 0;
}